

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.h
# Opt level: O2

result_type __thiscall
beast::uhash<beast::spooky>::operator()
          (uhash<beast::spooky> *this,base_uint<160UL,_jbcoin::detail::AccountIDTag> *t)

{
  size_t sVar1;
  spooky h;
  spooky sStack_138;
  
  sStack_138.state_.m_length = 0;
  sStack_138.state_.m_remainder = '\0';
  sStack_138.state_.m_state[0] = 1;
  sStack_138.state_.m_state[1] = 2;
  hash_append<beast::spooky,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>(&sStack_138,t);
  sVar1 = spooky::operator_cast_to_unsigned_long(&sStack_138);
  return sVar1;
}

Assistant:

result_type
    operator()(T const& t) const noexcept
    {
        Hasher h;
        hash_append (h, t);
        return static_cast<result_type>(h);
    }